

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::anon_unknown_8::TileBufferTask::execute(TileBufferTask *this)

{
  TileBuffer *pTVar1;
  TOutSliceInfo *pTVar2;
  long *plVar3;
  bool bVar4;
  int xOffsetForData;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  Data *pDVar8;
  Compression *pCVar9;
  Compressor *pCVar10;
  pointer ppTVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  pointer pcVar18;
  int iVar19;
  int yOffsetForData;
  pointer pcVar20;
  TileBufferTask *pTVar21;
  ulong uVar22;
  char *pcVar23;
  Box2i tileRange;
  int local_d0;
  char *writePtr_1;
  int local_bc;
  TileBufferTask *local_b8;
  char *writePtr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytesPerLine;
  vector<int,_std::allocator<int>_> yOffsets;
  vector<int,_std::allocator<int>_> xOffsets;
  char *compPtr;
  char *readPtr;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  pDVar8 = this->_ofd;
  pTVar1 = this->_tileBuffer;
  dataWindowForTile((Imf_2_5 *)&tileRange,&pDVar8->tileDesc,pDVar8->minX,pDVar8->maxX,pDVar8->minY,
                    pDVar8->maxY,*(int *)&pTVar1->_sem,*(int *)&pTVar1->field_0x5c,
                    *(int *)&pTVar1->field_0x60,*(int *)&pTVar1->field_0x64);
  local_bc = tileRange.max.y - tileRange.min.y;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bytesPerLine,(ulong)(this->_ofd->tileDesc).ySize,(allocator_type *)&xOffsets);
  std::vector<int,_std::allocator<int>_>::vector
            (&xOffsets,
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&yOffsets);
  std::vector<int,_std::allocator<int>_>::vector
            (&yOffsets,
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&writePtr_1);
  pDVar8 = this->_ofd;
  ppTVar11 = (pDVar8->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(pDVar8->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    lVar17 = 0;
    do {
      pTVar2 = ppTVar11[lVar17];
      xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] = tileRange.min.x * pTVar2->xTileCoords;
      yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] = tileRange.min.y * pTVar2->yTileCoords;
      lVar17 = lVar17 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
  }
  calculateBytesPerLine
            (&pDVar8->header,pDVar8->sampleCountSliceBase,pDVar8->sampleCountXStride,
             pDVar8->sampleCountYStride,tileRange.min.x,tileRange.max.x,tileRange.min.y,
             tileRange.max.y,&xOffsets,&yOffsets,&bytesPerLine);
  if ((long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar22 = 0;
    pcVar23 = (char *)0x0;
  }
  else {
    lVar12 = (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pcVar23 = (char *)0x0;
    uVar22 = 0;
    lVar17 = 0;
    do {
      uVar13 = bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar17];
      pcVar23 = pcVar23 + uVar13;
      if (uVar22 < uVar13) {
        uVar22 = uVar13;
      }
      lVar17 = lVar17 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
  }
  pTVar1 = this->_tileBuffer;
  pcVar7 = (char *)operator_new__((ulong)pcVar23);
  if (pTVar1->buffer != (char *)0x0) {
    operator_delete__(pTVar1->buffer);
  }
  pTVar1->uncompressedData = pcVar23;
  pTVar1->buffer = pcVar7;
  writePtr = this->_tileBuffer->buffer;
  local_d0 = this->_ofd->sampleCountXTileCoords;
  iVar5 = this->_ofd->sampleCountYTileCoords;
  if (local_d0 != 0) {
    local_d0 = tileRange.min.x;
  }
  if (iVar5 != 0) {
    iVar5 = tileRange.min.y;
  }
  local_b8 = this;
  if (tileRange.min.y <= tileRange.max.y) {
    iVar19 = tileRange.min.y;
    do {
      pDVar8 = this->_ofd;
      ppTVar11 = (pDVar8->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pDVar8->slices).
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar11) {
        uVar13 = 0;
        pTVar21 = this;
        uVar15 = 1;
        do {
          this = local_b8;
          pTVar2 = ppTVar11[uVar13];
          if (pTVar2->zero == true) {
            fillChannelWithZeroes
                      (&writePtr,pDVar8->format,pTVar2->type,
                       bytesPerLine.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar19 - (long)tileRange.min.y]);
            this = pTVar21;
          }
          else {
            xOffsetForData = pTVar2->xTileCoords;
            if (pTVar2->xTileCoords != 0) {
              xOffsetForData = tileRange.min.x;
            }
            yOffsetForData = pTVar2->yTileCoords;
            if (pTVar2->yTileCoords != 0) {
              yOffsetForData = tileRange.min.y;
            }
            copyFromDeepFrameBuffer
                      (&writePtr,pTVar2->base,pDVar8->sampleCountSliceBase,
                       (long)pDVar8->sampleCountXStride,(long)pDVar8->sampleCountYStride,iVar19,
                       tileRange.min.x,tileRange.max.x,local_d0,iVar5,xOffsetForData,yOffsetForData,
                       pTVar2->sampleStride,pTVar2->xStride,pTVar2->yStride,pDVar8->format,
                       pTVar2->type);
          }
          pDVar8 = this->_ofd;
          ppTVar11 = (pDVar8->slices).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar4 = uVar15 < (ulong)((long)(pDVar8->slices).
                                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11
                                  >> 3);
          uVar13 = uVar15;
          pTVar21 = this;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar4);
      }
      bVar4 = iVar19 < tileRange.max.y;
      iVar19 = iVar19 + 1;
    } while (bVar4);
  }
  lVar12 = 0;
  if (tileRange.min.y <= tileRange.max.y) {
    pcVar20 = (this->_tileBuffer->exception)._M_dataplus._M_p;
    lVar12 = 0;
    lVar17 = (long)tileRange.min.y;
    do {
      if (tileRange.min.x <= tileRange.max.x) {
        iVar19 = 0;
        lVar16 = (long)tileRange.min.x;
        do {
          pcVar18 = pcVar20;
          pDVar8 = this->_ofd;
          iVar19 = iVar19 + *(int *)(pDVar8->sampleCountSliceBase +
                                    (long)pDVar8->sampleCountXStride * (lVar16 - local_d0) +
                                    (long)pDVar8->sampleCountYStride * (lVar17 - iVar5));
          writePtr_1 = (char *)CONCAT44(writePtr_1._4_4_,iVar19);
          lVar14 = 0;
          do {
            pcVar18[lVar14] = *(char *)((long)&writePtr_1 + lVar14);
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 != 4);
          lVar12 = lVar12 + 4;
          bVar4 = lVar16 < tileRange.max.x;
          lVar16 = lVar16 + 1;
          pcVar20 = pcVar18 + lVar14;
        } while (bVar4);
        pcVar20 = pcVar18 + lVar14;
      }
      bVar4 = lVar17 < tileRange.max.y;
      lVar17 = lVar17 + 1;
    } while (bVar4);
  }
  pTVar1 = this->_tileBuffer;
  plVar3 = *(long **)((long)&(pTVar1->exception).field_2 + 8);
  if (plVar3 != (long *)0x0) {
    iVar5 = (**(code **)(*plVar3 + 0x20))
                      (plVar3,(pTVar1->exception)._M_dataplus._M_p,lVar12,tileRange.min.y,
                       &(pTVar1->exception)._M_string_length);
    *(long *)&(this->_tileBuffer->exception).field_2 = (long)iVar5;
  }
  pTVar1 = this->_tileBuffer;
  if ((*(long *)((long)&(pTVar1->exception).field_2 + 8) == 0) ||
     (this->_ofd->maxSampleCountTableSize <= (pTVar1->exception).field_2._M_allocated_capacity)) {
    (pTVar1->exception).field_2._M_allocated_capacity = this->_ofd->maxSampleCountTableSize;
    (pTVar1->exception)._M_string_length = (size_type)(pTVar1->exception)._M_dataplus._M_p;
  }
  pTVar1->compressor = (Compressor *)(writePtr + -(long)pTVar1->buffer);
  *(Compressor **)&pTVar1->format = (Compressor *)(writePtr + -(long)pTVar1->buffer);
  *(char **)&pTVar1->dataSize = pTVar1->buffer;
  if (*(long **)&pTVar1->dy != (long *)0x0) {
    (**(code **)(**(long **)&pTVar1->dy + 8))();
  }
  pCVar9 = Header::compression(&this->_ofd->header);
  pCVar10 = newTileCompressor(*pCVar9,uVar22,(ulong)(this->_ofd->tileDesc).ySize,&this->_ofd->header
                             );
  pTVar1 = this->_tileBuffer;
  *(Compressor **)&pTVar1->dy = pCVar10;
  if (pCVar10 != (Compressor *)0x0) {
    local_48 = tileRange.min.x;
    iStack_44 = tileRange.min.y;
    iStack_40 = tileRange.max.x;
    iStack_3c = tileRange.max.y;
    iVar5 = (*pCVar10->_vptr_Compressor[5])
                      (pCVar10,*(undefined8 *)&pTVar1->dataSize,(ulong)*(uint *)&pTVar1->compressor,
                       &local_48,&compPtr);
    pTVar1 = this->_tileBuffer;
    if ((Compressor *)(long)iVar5 < pTVar1->compressor) {
      pTVar1->compressor = (Compressor *)(long)iVar5;
      *(char **)&pTVar1->dataSize = compPtr;
    }
    else {
      pDVar8 = this->_ofd;
      if ((pDVar8->format == NATIVE) &&
         (writePtr_1 = pTVar1->buffer, readPtr = writePtr_1, -1 < local_bc)) {
        uVar6 = local_bc + 1;
        uVar22 = 0;
        do {
          ppTVar11 = (pDVar8->slices).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar8->slices).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppTVar11) {
            uVar13 = 0;
            uVar15 = 1;
            do {
              convertInPlace(&writePtr_1,&readPtr,ppTVar11[uVar13]->type,
                             bytesPerLine.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar22]);
              ppTVar11 = (pDVar8->slices).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar4 = uVar15 < (ulong)((long)(pDVar8->slices).
                                             super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppTVar11 >> 3);
              uVar13 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar4);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar6);
      }
    }
  }
  if (yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)bytesPerLine.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bytesPerLine.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
	// into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //
    
        char *writePtr = _tileBuffer->buffer;
    
        Box2i tileRange = dataWindowForTile (_ofd->tileDesc,
                                                  _ofd->minX, _ofd->maxX,
                                                  _ofd->minY, _ofd->maxY,
                                                  _tileBuffer->tileCoord.dx,
                                                  _tileBuffer->tileCoord.dy,
                                                  _tileBuffer->tileCoord.lx,
                                                  _tileBuffer->tileCoord.ly);
    
        int numScanLines = tileRange.max.y - tileRange.min.y + 1;
        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;
    
        //
        // Iterate over the scan lines in the tile.
        //
        
        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //
    
            for (unsigned int i = 0; i < _ofd->slices.size(); ++i)
            {
                const TOutSliceInfo &slice = _ofd->slices[i];
    
                //
                // These offsets are used to facilitate both absolute
                // and tile-relative pixel coordinates.
                //
            
                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;
    
		//
		// Fill the tile buffer with pixel data.
		//

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //
                    
                    fillChannelWithZeroes (writePtr, _ofd->format, slice.type,
                                           numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //
    
                    const char *readPtr = slice.base +
                                          (y - yOffset) * slice.yStride +
                                          (tileRange.min.x - xOffset) *
                                          slice.xStride;

                    const char *endPtr  = readPtr +
                                          (numPixelsPerScanLine - 1) *
                                          slice.xStride;
                                        
                    copyFromFrameBuffer (writePtr, readPtr, endPtr,
                                         slice.xStride, _ofd->format,
                                         slice.type);
                }
            }
        }
        
        //
        // Compress the contents of the tileBuffer, 
        // and store the compressed data in the output file.
        //
    
        _tileBuffer->dataSize = writePtr - _tileBuffer->buffer;
        _tileBuffer->dataPtr = _tileBuffer->buffer;
    
        if (_tileBuffer->compressor)
        {
            const char *compPtr;

            int compSize = _tileBuffer->compressor->compressTile
                                                (_tileBuffer->dataPtr,
                                                 _tileBuffer->dataSize,
                                                 tileRange, compPtr);
    
            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //
    
                convertToXdr (_ofd, _tileBuffer->buffer, numScanLines,
                              numPixelsPerScanLine);
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}